

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O0

void text_rasterizer_init(bov_window_t *window)

{
  long lVar1;
  long lVar2;
  long lVar3;
  PFNGLUNIFORM1IPROC p_Var4;
  uint uVar5;
  int iVar6;
  int iVar7;
  GLuint GVar8;
  GLuint GVar9;
  GLuint GVar10;
  GLint GVar11;
  void *data;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  uint objectBlockIndex;
  uint worldBlockIndex;
  GLuint program;
  uint index_3;
  uint x_2;
  uint x_1;
  uint index_2;
  uint y_2;
  uint index_1;
  uint y_1;
  double ampl;
  int gy;
  int gx;
  uint index;
  uint x;
  uint y;
  int smoothing [2];
  GLubyte (*image) [3];
  bov_window_t *window_local;
  
  data = malloc(0x12c000);
  if (data == (void *)0x0) {
    bov_error_log(0x30001,"Memory allocation failed");
    fprintf(_stderr,"\t(in function %s, line %d)\n","text_rasterizer_init",0xf8);
    exit(1);
  }
  for (index = 1; index < 0x27f; index = index + 1) {
    for (gx = 1; (uint)gx < 0x27f; gx = gx + 1) {
      uVar5 = index * 0x280 + gx;
      lVar1 = (ulong)(index - 1) * 0x280 + 0x12a1e0;
      uVar13 = (ulong)(gx - 1);
      uVar12 = (ulong)(gx + 1);
      lVar2 = (ulong)index * 0x280 + 0x12a1e0;
      lVar3 = (ulong)(index + 1) * 0x280 + 0x12a1e0;
      iVar6 = (uint)*(byte *)(uVar13 + lVar1) * 0x2f + (uint)*(byte *)(uVar12 + lVar1) * -0x2f +
              (uint)*(byte *)(uVar13 + lVar2) * 0xa2 + (uint)*(byte *)(uVar12 + lVar2) * -0xa2 +
              (uint)*(byte *)(uVar13 + lVar3) * 0x2f + (uint)*(byte *)(uVar12 + lVar3) * -0x2f;
      lVar1 = (ulong)(index - 1) * 0x280 + 0x12a1e0;
      lVar2 = (ulong)(index + 1) * 0x280 + 0x12a1e0;
      iVar7 = (uint)*(byte *)((ulong)(gx - 1) + lVar1) * 0x2f +
              (uint)*(byte *)((ulong)(uint)gx + lVar1) * 0xa2 +
              (uint)*(byte *)((ulong)(gx + 1) + lVar1) * 0x2f +
              (uint)*(byte *)((ulong)(gx - 1) + lVar2) * -0x2f +
              (uint)*(byte *)((ulong)(uint)gx + lVar2) * -0xa2 +
              (uint)*(byte *)((ulong)(gx + 1) + lVar2) * -0x2f;
      *(undefined1 *)((long)data + (ulong)uVar5 * 3) =
           *(undefined1 *)((ulong)(uint)gx + (ulong)index * 0x280 + 0x12a1e0);
      dVar14 = sqrt((double)(iVar6 * iVar6 + iVar7 * iVar7));
      dVar15 = ((double)iVar6 / dVar14) * 128.0 + 128.0;
      if (dVar15 <= 0.0) {
        dVar15 = 0.0;
      }
      if (255.9 <= dVar15) {
        dVar15 = 255.9;
      }
      *(char *)((long)data + (ulong)uVar5 * 3 + 1) = (char)(int)dVar15;
      dVar15 = ((double)iVar7 / dVar14) * 128.0 + 128.0;
      if (dVar15 <= 0.0) {
        dVar15 = 0.0;
      }
      if (255.9 <= dVar15) {
        dVar15 = 255.9;
      }
      *(char *)((long)data + (ulong)uVar5 * 3 + 2) = (char)(int)dVar15;
    }
  }
  for (y_2 = 0; y_2 < 0x280; y_2 = y_2 + 1) {
    uVar5 = y_2 * 0x280;
    *(uchar *)((long)data + (ulong)uVar5 * 3) = font.tex_data[y_2][0];
    *(undefined1 *)((long)data + (ulong)uVar5 * 3 + 1) = 0;
    *(undefined1 *)((long)data + (ulong)uVar5 * 3 + 2) = 0;
  }
  for (x_1 = 0; x_1 < 0x280; x_1 = x_1 + 1) {
    uVar5 = x_1 * 0x280 + 0x27f;
    *(uchar *)((long)data + (ulong)uVar5 * 3) = font.tex_data[x_1][0x27f];
    *(undefined1 *)((long)data + (ulong)uVar5 * 3 + 1) = 0;
    *(undefined1 *)((long)data + (ulong)uVar5 * 3 + 2) = 0;
  }
  for (index_3 = 1; index_3 < 0x27f; index_3 = index_3 + 1) {
    *(uchar *)((long)data + (ulong)index_3 * 3) = font.tex_data[0][index_3];
    *(undefined1 *)((long)data + (ulong)index_3 * 3 + 1) = 0;
    *(undefined1 *)((long)data + (ulong)index_3 * 3 + 2) = 0;
  }
  for (program = 1; program < 0x27f; program = program + 1) {
    uVar5 = program + 0x63d80;
    *(uchar *)((long)data + (ulong)uVar5 * 3) = font.tex_data[0x27f][program];
    *(undefined1 *)((long)data + (ulong)uVar5 * 3 + 1) = 0;
    *(undefined1 *)((long)data + (ulong)uVar5 * 3 + 2) = 0;
  }
  (*glad_glActiveTexture)(0x84c0);
  GVar8 = create_texture(0x280,0x280,data,0x1907,0x1907,0x812f);
  window->font_atlas_texture = GVar8;
  free(data);
  GVar8 = window->program[0];
  (*glad_glUseProgram)(GVar8);
  GVar9 = (*glad_glGetUniformBlockIndex)(GVar8,"worldBlock");
  GVar10 = (*glad_glGetUniformBlockIndex)(GVar8,"objectBlock");
  (*glad_glUniformBlockBinding)(GVar8,GVar9,0);
  (*glad_glUniformBlockBinding)(GVar8,GVar10,1);
  p_Var4 = glad_glUniform1i;
  GVar11 = (*glad_glGetUniformLocation)(GVar8,"fontTex");
  (*p_Var4)(GVar11,0);
  return;
}

Assistant:

static void text_rasterizer_init(bov_window_t* window)
{
	GLubyte (*image)[3] = malloc(sizeof(char) * 3 *
									   font.tex_width * font.tex_height);
	CHECK_MALLOC(image);

	// int smoothing[2] = {1, 2/*, 1*/}; // smoothing in Sobel kernel
	// int smoothing[2] = {3, 10/*, 3*/};   // in Scharr kernel
	int smoothing[2] = {47, 162/*, 47*/};// wikipedia optimal Scharr
	// int smoothing[2] = {0, 1/*, 0*/}; // no smoothing
	// int smoothing[2] = {1,1/*,1*/}; // mega smoothing

	// compute derivatives with a sort of Sobel kernel, which is
	// a combination of finite difference and smoothing
	for(unsigned y=1; y<font.tex_height-1; y++) {
		for(unsigned x=1; x<font.tex_width-1; x++) {
			unsigned index = y * font.tex_width + x;
			int gx =  font.tex_data[y-1][x-1] * ( smoothing[0]) +
			          font.tex_data[y-1][x+1] * (-smoothing[0]) +
			          font.tex_data[y][x-1]   * ( smoothing[1]) +
			          font.tex_data[y][x+1]   * (-smoothing[1]) +
			          font.tex_data[y+1][x-1] * ( smoothing[0]) +
			          font.tex_data[y+1][x+1] * (-smoothing[0]);

			int gy =  font.tex_data[y-1][x-1] * ( smoothing[0]) +
			          font.tex_data[y-1][x+0] * ( smoothing[1]) +
			          font.tex_data[y-1][x+1] * ( smoothing[0]) +
			          font.tex_data[y+1][x-1] * (-smoothing[0]) +
			          font.tex_data[y+1][x+0] * (-smoothing[1]) +
			          font.tex_data[y+1][x+1] * (-smoothing[0]);


			image[index][0] = font.tex_data[y][x];
			double ampl = sqrt(gx * gx + gy * gy);
			image[index][1] = (GLubyte) fmin(255.9, fmax(0.0, gx / ampl * 128. + 128.));
			image[index][2] = (GLubyte) fmin(255.9, fmax(0.0, gy / ampl * 128. + 128.));
		}
	}

	for(unsigned y=0; y<font.tex_height; y++) {
		unsigned index = y * font.tex_width;
		image[index][0] = font.tex_data[y][0];
		image[index][1] = 0;
		image[index][2] = 0;
	}

	for(unsigned y=0; y<font.tex_height; y++) {
		unsigned index = y * font.tex_width + font.tex_width - 1;
		image[index][0] = font.tex_data[y][font.tex_width - 1];
		image[index][1] = 0;
		image[index][2] = 0;
	}

	for(unsigned x=1; x<font.tex_width-1; x++) {
		image[x][0] = font.tex_data[0][x];
		image[x][1] = 0;
		image[x][2] = 0;
	}

	for(unsigned x=1; x<font.tex_width-1; x++) {
		unsigned index = (font.tex_height - 1) * font.tex_width + x;
		image[index][0] = font.tex_data[font.tex_height - 1][x];
		image[index][1] = 0;
		image[index][2] = 0;
	}

	glActiveTexture(GL_TEXTURE0 + FONT_ATLAS_TEXTURE_UNIT);
	window->font_atlas_texture = create_texture(font.tex_width,
	                                            font.tex_height,
	                                            image,
	                                            GL_RGB,
	                                            GL_RGB,
	                                            GL_CLAMP_TO_EDGE);
	free(image);

	GLuint program = window->program[TEXT_PROGRAM_INDEX];
	glUseProgram(program);

	unsigned worldBlockIndex = glGetUniformBlockIndex(program, "worldBlock");
	unsigned objectBlockIndex = glGetUniformBlockIndex(program, "objectBlock");
	glUniformBlockBinding(program, worldBlockIndex, 0);
	glUniformBlockBinding(program, objectBlockIndex, 1);

	// uniform retain their value for the lifetime of a program
	// see glspec41.core 2.11.7
	glUniform1i(glGetUniformLocation(program, "fontTex"),
	                                 FONT_ATLAS_TEXTURE_UNIT);
}